

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_get_http_var(mg_str *buf,char *name,char *dst,size_t dst_len)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t len;
  void *pvVar8;
  long lVar9;
  char *pcVar10;
  
  iVar6 = -2;
  if (dst_len != 0 && dst != (char *)0x0) {
    pcVar10 = buf->p;
    if ((name == (char *)0x0 || pcVar10 == (char *)0x0) || (sVar2 = buf->len, sVar2 == 0)) {
      *dst = '\0';
      iVar6 = -1;
    }
    else {
      len = strlen(name);
      pcVar10 = pcVar10 + sVar2;
      *dst = '\0';
      pcVar3 = buf->p;
      pcVar1 = pcVar3 + len;
      iVar6 = -1;
      if (pcVar1 < pcVar10) {
        lVar9 = 0;
        do {
          if ((((lVar9 == 0) || (pcVar3[lVar9 + -1] == '&')) && (pcVar1[lVar9] == '=')) &&
             (iVar5 = mg_ncasecmp(name,pcVar3 + lVar9,len), iVar5 == 0)) {
            pvVar8 = memchr(pcVar1 + lVar9 + 1,0x26,
                            (size_t)(pcVar10 + ((~len - (long)pcVar3) - lVar9)));
            iVar6 = (int)pcVar10;
            if (pvVar8 != (void *)0x0) {
              iVar6 = (int)pvVar8;
            }
            uVar7 = mg_url_decode(pcVar1 + lVar9 + 1,
                                  (iVar6 + ~((int)pcVar3 + (int)len)) - (int)lVar9,dst,(int)dst_len,
                                  1);
            if (uVar7 < 0xfffffffe) {
              return uVar7;
            }
            return -2;
          }
          lVar4 = lVar9 + 1;
          lVar9 = lVar9 + 1;
        } while (pcVar1 + lVar4 < pcVar10);
      }
    }
  }
  return iVar6;
}

Assistant:

int mg_get_http_var(const struct mg_str *buf, const char *name, char *dst,
                    size_t dst_len) {
    const char *p, *e, *s;
    size_t name_len;
    int len;

    if (dst == NULL || dst_len == 0) {
        len = -2;
    } else if (buf->p == NULL || name == NULL || buf->len == 0) {
        len = -1;
        dst[0] = '\0';
    } else {
        name_len = strlen(name);
        e = buf->p + buf->len;
        len = -1;
        dst[0] = '\0';

        for (p = buf->p; p + name_len < e; p++) {
            if ((p == buf->p || p[-1] == '&') && p[name_len] == '=' &&
                !mg_ncasecmp(name, p, name_len)) {
                p += name_len + 1;
                s = (const char *) memchr(p, '&', (size_t) (e - p));
                if (s == NULL) {
                    s = e;
                }
                len = mg_url_decode(p, (size_t) (s - p), dst, dst_len, 1);
                if (len == -1) {
                    len = -2;
                }
                break;
            }
        }
    }

    return len;
}